

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options_serializer_boost_po.h
# Opt level: O0

bool __thiscall
VW::config::options_serializer_boost_po::serialize_if_t<std::vector<float,std::allocator<float>>>
          (options_serializer_boost_po *this,base_option *base_option)

{
  type_info *ptVar1;
  typed_option<std::vector<float,_std::allocator<float>_>_> *this_00;
  long in_RSI;
  typed_option<std::vector<float,_std::allocator<float>_>_> typed;
  typed_option<std::vector<float,_std::allocator<float>_>_> *ptVar2;
  type_info *this_01;
  typed_option<std::vector<float,_std::allocator<float>_>_> *in_stack_fffffffffffffed8;
  options_serializer_boost_po *in_stack_fffffffffffffee0;
  typed_option<std::vector<float,_std::allocator<float>_>_> local_b8;
  long local_18;
  byte local_1;
  
  this_01 = *(type_info **)(in_RSI + 0x28);
  local_18 = in_RSI;
  ptVar1 = (type_info *)std::type_info::hash_code(this_01);
  if (this_01 == ptVar1) {
    this_00 = (typed_option<std::vector<float,_std::allocator<float>_>_> *)
              __dynamic_cast(local_18,&config::base_option::typeinfo,
                             &typed_option<std::vector<float,std::allocator<float>>>::typeinfo,0);
    if (this_00 == (typed_option<std::vector<float,_std::allocator<float>_>_> *)0x0) {
      __cxa_bad_cast();
    }
    ptVar2 = &local_b8;
    typed_option<std::vector<float,_std::allocator<float>_>_>::typed_option(this_00,ptVar2);
    typed_option<std::vector<float,_std::allocator<float>_>_>::typed_option(this_00,ptVar2);
    serialize<float>(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
    typed_option<std::vector<float,_std::allocator<float>_>_>::~typed_option(this_00);
    local_1 = 1;
    typed_option<std::vector<float,_std::allocator<float>_>_>::~typed_option(this_00);
  }
  else {
    local_1 = 0;
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool serialize_if_t(base_option& base_option)
  {
    if (base_option.m_type_hash == typeid(T).hash_code())
    {
      auto typed = dynamic_cast<typed_option<T>&>(base_option);
      serialize(typed);
      return true;
    }

    return false;
  }